

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::DGXMLScanner::scanStartTagNS(DGXMLScanner *this,bool *gotData)

{
  Grammar *pGVar1;
  XMLValidator *pXVar2;
  XMLDocumentHandler *pXVar3;
  DTDAttDef *pDVar4;
  XMLAttDef *attrRawName;
  XMLElementDecl *text1;
  bool bVar5;
  int iVar6;
  uint uVar7;
  XMLCh *pXVar8;
  undefined4 extraout_var;
  DTDElementDecl *pDVar9;
  XMLSize_t XVar10;
  XMLReader *pXVar11;
  XMLAttr *this_00;
  UnexpectedEOFException *this_01;
  QName *pQVar12;
  undefined4 extraout_var_00;
  AttTypes local_11c;
  undefined1 local_b0 [7];
  bool res;
  XMLSize_t failure;
  uint *puStack_a0;
  uint uriId;
  uint *curCountPtr;
  XMLCh *attLocalName;
  XMLCh *attPrefix;
  XMLCh *attrValue;
  XMLAttr *curAtt;
  DTDAttDef *pDStack_70;
  XMLCh chFound_1;
  XMLAttDef *attDef;
  XMLCh *namePtr;
  XMLCh chFound;
  XMLSize_t XStack_58;
  XMLCh nextCh;
  XMLSize_t curAttListSize;
  XMLSize_t attCount;
  DTDElementDecl *local_38;
  XMLElementDecl *elemDecl;
  XMLCh *qnameRawBuf;
  bool wasAdded;
  bool isRoot;
  bool isEmpty;
  bool validName;
  int colonPosition;
  bool *gotData_local;
  DGXMLScanner *this_local;
  
  *gotData = true;
  _wasAdded = gotData;
  gotData_local = (bool *)this;
  qnameRawBuf._3_1_ =
       ReaderMgr::getQName(&(this->super_XMLScanner).fReaderMgr,&(this->super_XMLScanner).fQNameBuf,
                           (int *)((long)&qnameRawBuf + 4));
  if (!(bool)qnameRawBuf._3_1_) {
    bVar5 = XMLBuffer::isEmpty(&(this->super_XMLScanner).fQNameBuf);
    if (bVar5) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedElementName);
    }
    else {
      pXVar8 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fQNameBuf);
      XMLScanner::emitError
                (&this->super_XMLScanner,InvalidElementName,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    ReaderMgr::skipToChar(&(this->super_XMLScanner).fReaderMgr,L'<');
    return false;
  }
  qnameRawBuf._2_1_ = 0;
  qnameRawBuf._1_1_ = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
  qnameRawBuf._0_1_ = 0;
  elemDecl = (XMLElementDecl *)XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fQNameBuf);
  pGVar1 = (this->super_XMLScanner).fGrammar;
  iVar6 = (*(pGVar1->super_XSerializable)._vptr_XSerializable[0xb])
                    (pGVar1,(ulong)(this->super_XMLScanner).fEmptyNamespaceId,0,elemDecl,0xfffffffe)
  ;
  local_38 = (DTDElementDecl *)CONCAT44(extraout_var,iVar6);
  if (local_38 == (DTDElementDecl *)0x0) {
    local_38 = NameIdPool<xercesc_4_0::DTDElementDecl>::getByKey
                         (this->fDTDElemNonDeclPool,(XMLCh *)elemDecl);
  }
  if (local_38 == (DTDElementDecl *)0x0) {
    qnameRawBuf._0_1_ = 1;
    pDVar9 = (DTDElementDecl *)XMemory::operator_new(0x58,(this->super_XMLScanner).fMemoryManager);
    DTDElementDecl::DTDElementDecl
              (pDVar9,(XMLCh *)elemDecl,(this->super_XMLScanner).fEmptyNamespaceId,Any,
               (this->super_XMLScanner).fMemoryManager);
    local_38 = pDVar9;
    XVar10 = NameIdPool<xercesc_4_0::DTDElementDecl>::put(this->fDTDElemNonDeclPool,pDVar9);
    XMLElementDecl::setId((XMLElementDecl *)pDVar9,XVar10);
  }
  if (((this->super_XMLScanner).fValidate & 1U) != 0) {
    if (((byte)qnameRawBuf & 1) == 0) {
      bVar5 = XMLElementDecl::isDeclared(&local_38->super_XMLElementDecl);
      if (!bVar5) {
        XMLValidator::emitError
                  ((this->super_XMLScanner).fValidator,ElementNotDefined,(XMLCh *)elemDecl,
                   (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    else {
      XMLElementDecl::setCreateReason(&local_38->super_XMLElementDecl,JustFaultIn);
      XMLValidator::emitError
                ((this->super_XMLScanner).fValidator,ElementNotDefined,(XMLCh *)elemDecl,
                 (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    pXVar2 = (this->super_XMLScanner).fValidator;
    (*pXVar2->_vptr_XMLValidator[9])(pXVar2,local_38);
  }
  pDVar9 = local_38;
  XVar10 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
  ElemStack::addLevel(&(this->super_XMLScanner).fElemStack,&pDVar9->super_XMLElementDecl,XVar10);
  if ((qnameRawBuf._1_1_ & 1) == 0) {
    if (((this->super_XMLScanner).fValidate & 1U) != 0) {
      pQVar12 = XMLElementDecl::getElementName(&local_38->super_XMLElementDecl);
      ElemStack::addChild(&(this->super_XMLScanner).fElemStack,pQVar12,true);
    }
  }
  else {
    (this->super_XMLScanner).fRootGrammar = (this->super_XMLScanner).fGrammar;
    if (((((this->super_XMLScanner).fValidate & 1U) != 0) &&
        ((this->super_XMLScanner).fRootElemName != (XMLCh *)0x0)) &&
       (bVar5 = XMLString::equals((XMLCh *)elemDecl,(this->super_XMLScanner).fRootElemName), !bVar5)
       ) {
      XMLValidator::emitError((this->super_XMLScanner).fValidator,RootElemNotLikeDocType);
    }
  }
  ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
  curAttListSize = 0;
  XStack_58 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::size
                        (&((this->super_XMLScanner).fAttrList)->
                          super_BaseRefVectorOf<xercesc_4_0::XMLAttr>);
  qnameRawBuf._0_1_ = 0;
  this->fElemCount = this->fElemCount + 1;
LAB_00340162:
  namePtr._6_2_ = ReaderMgr::peekNextChar(&(this->super_XMLScanner).fReaderMgr);
  if (((curAttListSize != 0) && (namePtr._6_2_ != L'/')) && (namePtr._6_2_ != L'>')) {
    pXVar11 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
    bVar5 = XMLReader::isWhitespace(pXVar11,namePtr._6_2_);
    if (bVar5) {
      ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
      namePtr._6_2_ = ReaderMgr::peekNextChar(&(this->super_XMLScanner).fReaderMgr);
    }
    else {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedWhitespace);
    }
  }
  pXVar11 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
  bVar5 = XMLReader::isSpecialStartTagChar(pXVar11,namePtr._6_2_);
  if (!bVar5) {
    qnameRawBuf._3_1_ =
         ReaderMgr::getQName(&(this->super_XMLScanner).fReaderMgr,
                             &(this->super_XMLScanner).fAttNameBuf,(int *)((long)&qnameRawBuf + 4));
    if (!(bool)qnameRawBuf._3_1_) {
      bVar5 = XMLBuffer::isEmpty(&(this->super_XMLScanner).fAttNameBuf);
      if (bVar5) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
      }
      else {
        pXVar8 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttNameBuf);
        XMLScanner::emitError
                  (&this->super_XMLScanner,InvalidAttrName,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
      return false;
    }
    bVar5 = XMLScanner::scanEq(&this->super_XMLScanner,false);
    if (!bVar5) goto code_r0x003402e0;
    goto LAB_003403a6;
  }
  if (namePtr._6_2_ == L'\0') {
    this_01 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
    UnexpectedEOFException::UnexpectedEOFException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
               ,0x745,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(this_01,&UnexpectedEOFException::typeinfo,
                UnexpectedEOFException::~UnexpectedEOFException);
  }
  if (namePtr._6_2_ == L'/') {
    ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
    qnameRawBuf._2_1_ = 1;
    bVar5 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    if (!bVar5) {
      pXVar8 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedStartTag,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
  }
  else if (namePtr._6_2_ == L'>') {
    ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
  }
  else {
    if (namePtr._6_2_ != L'<') {
      if ((namePtr._6_2_ == L'\'') || (namePtr._6_2_ == L'\"')) {
        XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrName);
        ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
        ReaderMgr::skipQuotedString(&(this->super_XMLScanner).fReaderMgr,namePtr._6_2_);
        ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
      }
      goto LAB_00340162;
    }
    pXVar8 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
    XMLScanner::emitError
              (&this->super_XMLScanner,UnterminatedStartTag,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
  }
  if (curAttListSize != 0) {
    scanAttrListforNameSpaces
              (this,(this->super_XMLScanner).fAttrList,curAttListSize,
               &local_38->super_XMLElementDecl);
  }
  if (curAttListSize != 0) {
    Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll(this->fUndeclaredAttrRegistry);
  }
  curAttListSize =
       buildAttList(this,curAttListSize,&local_38->super_XMLElementDecl,
                    (this->super_XMLScanner).fAttrList);
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    pQVar12 = XMLElementDecl::getElementName(&local_38->super_XMLElementDecl);
    pXVar8 = QName::getPrefix(pQVar12);
    uVar7 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar8,Mode_Element);
    pDVar9 = local_38;
    pXVar3 = (this->super_XMLScanner).fDocHandler;
    failure._4_4_ = uVar7;
    pQVar12 = XMLElementDecl::getElementName(&local_38->super_XMLElementDecl);
    pXVar8 = QName::getPrefix(pQVar12);
    (*pXVar3->_vptr_XMLDocumentHandler[0xb])
              (pXVar3,pDVar9,(ulong)uVar7,pXVar8,(this->super_XMLScanner).fAttrList,curAttListSize,
               (uint)(qnameRawBuf._2_1_ & 1),(uint)(qnameRawBuf._1_1_ & 1));
  }
  if ((qnameRawBuf._2_1_ & 1) != 0) {
    if ((((this->super_XMLScanner).fValidate & 1U) != 0) &&
       (pXVar2 = (this->super_XMLScanner).fValidator,
       uVar7 = (*pXVar2->_vptr_XMLValidator[2])(pXVar2,local_38,0,0,local_b0), text1 = elemDecl,
       (uVar7 & 1) == 0)) {
      pXVar2 = (this->super_XMLScanner).fValidator;
      iVar6 = (*(local_38->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])();
      XMLValidator::emitError
                (pXVar2,ElementNotValidForContent,(XMLCh *)text1,
                 (XMLCh *)CONCAT44(extraout_var_00,iVar6),(XMLCh *)0x0,(XMLCh *)0x0);
    }
    ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
    if ((qnameRawBuf._1_1_ & 1) != 0) {
      *_wasAdded = false;
    }
  }
  return true;
code_r0x003402e0:
  XMLScanner::emitError(&this->super_XMLScanner,ExpectedEqSign);
  namePtr._4_2_ = ReaderMgr::skipUntilInOrWS(&(this->super_XMLScanner).fReaderMgr,L"\'\"></");
  if ((namePtr._4_2_ != L'>') && (namePtr._4_2_ != L'/')) {
    if ((namePtr._4_2_ != L'\'') && (namePtr._4_2_ != L'\"')) {
      pXVar11 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
      bVar5 = XMLReader::isWhitespace(pXVar11,namePtr._4_2_);
      if (!bVar5) {
        if (namePtr._4_2_ != L'<') {
          return false;
        }
        pXVar8 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
        XMLScanner::emitError
                  (&this->super_XMLScanner,UnterminatedStartTag,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
        return false;
      }
    }
LAB_003403a6:
    attDef = (XMLAttDef *)XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttNameBuf);
    pDStack_70 = DTDElementDecl::getAttDef(local_38,(XMLCh *)attDef);
    ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
    bVar5 = scanAttValue(this,&pDStack_70->super_XMLAttDef,(XMLCh *)attDef,
                         &(this->super_XMLScanner).fAttValueBuf);
    if (!bVar5) {
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedAttrValue);
      curAtt._6_2_ = ReaderMgr::skipUntilInOrWS(&(this->super_XMLScanner).fReaderMgr,L"></");
      if ((curAtt._6_2_ != L'>') && (curAtt._6_2_ != L'/')) {
        pXVar11 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
        bVar5 = XMLReader::isWhitespace(pXVar11,curAtt._6_2_);
        if (!bVar5) {
          if (curAtt._6_2_ != L'<') {
            return false;
          }
          pXVar8 = XMLElementDecl::getFullName(&local_38->super_XMLElementDecl);
          XMLScanner::emitError
                    (&this->super_XMLScanner,UnterminatedStartTag,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
          return false;
        }
      }
    }
    attPrefix = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttValueBuf);
    if (curAttListSize < XStack_58) {
      attrValue = (XMLCh *)BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                     (&((this->super_XMLScanner).fAttrList)->
                                       super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,curAttListSize);
    }
    else {
      this_00 = (XMLAttr *)XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
      XMLAttr::XMLAttr(this_00,(this->super_XMLScanner).fMemoryManager);
      attrValue = (XMLCh *)this_00;
      BaseRefVectorOf<xercesc_4_0::XMLAttr>::addElement
                (&((this->super_XMLScanner).fAttrList)->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,
                 this_00);
    }
    XMLAttr::setSpecified((XMLAttr *)attrValue,true);
    attrRawName = attDef;
    pXVar8 = attrValue;
    uVar7 = (this->super_XMLScanner).fEmptyNamespaceId;
    if (pDStack_70 == (DTDAttDef *)0x0) {
      local_11c = AttTypes_Min;
    }
    else {
      local_11c = XMLAttDef::getType(&pDStack_70->super_XMLAttDef);
    }
    XMLAttr::set((XMLAttr *)pXVar8,uVar7,(XMLCh *)attrRawName,L"",local_11c,(DatatypeValidator *)0x0
                 ,false);
    attLocalName = XMLAttr::getPrefix((XMLAttr *)attrValue);
    curCountPtr = (uint *)XMLAttr::getName((XMLAttr *)attrValue);
    if ((attLocalName == (XMLCh *)0x0) || (*attLocalName == L'\0')) {
      bVar5 = XMLString::equals((XMLCh *)XMLUni::fgXMLNSString,(XMLCh *)curCountPtr);
      if (bVar5) {
        updateNSMap(this,attLocalName,L"",attPrefix);
      }
    }
    else {
      bVar5 = XMLString::equals(attLocalName,L"xml");
      if (bVar5) {
        XMLAttr::setURIId((XMLAttr *)attrValue,(this->super_XMLScanner).fXMLNamespaceId);
      }
      else {
        bVar5 = XMLString::equals(attLocalName,(XMLCh *)XMLUni::fgXMLNSString);
        if (bVar5) {
          XMLAttr::setURIId((XMLAttr *)attrValue,(this->super_XMLScanner).fXMLNSNamespaceId);
          updateNSMap(this,attLocalName,(XMLCh *)curCountPtr,attPrefix);
        }
        else {
          ValueVectorOf<xercesc_4_0::XMLAttr_*>::addElement
                    (this->fAttrNSList,(XMLAttr **)&attrValue);
        }
      }
    }
    if (pDStack_70 != (DTDAttDef *)0x0) {
      puStack_a0 = RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::get
                             (this->fAttDefRegistry,pDStack_70);
      if (puStack_a0 == (uint *)0x0) {
        puStack_a0 = XMLScanner::getNewUIntPtr(&this->super_XMLScanner);
        *puStack_a0 = this->fElemCount;
        RefHashTableOf<unsigned_int,_xercesc_4_0::PtrHasher>::put
                  (this->fAttDefRegistry,pDStack_70,puStack_a0);
      }
      else if (*puStack_a0 < this->fElemCount) {
        *puStack_a0 = this->fElemCount;
      }
    }
    pDVar4 = pDStack_70;
    if (((this->super_XMLScanner).fValidate & 1U) != 0) {
      if (pDStack_70 == (DTDAttDef *)0x0) {
        pXVar2 = (this->super_XMLScanner).fValidator;
        pXVar8 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttNameBuf);
        XMLValidator::emitError
                  (pXVar2,AttNotDefinedForElement,pXVar8,(XMLCh *)elemDecl,(XMLCh *)0x0,(XMLCh *)0x0
                  );
      }
      else {
        pXVar2 = (this->super_XMLScanner).fValidator;
        pXVar8 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fAttValueBuf);
        (*pXVar2->_vptr_XMLValidator[8])(pXVar2,pDVar4,pXVar8,0,local_38);
      }
    }
    XMLAttr::setValue((XMLAttr *)attrValue,attPrefix);
    curAttListSize = curAttListSize + 1;
  }
  goto LAB_00340162;
}

Assistant:

bool DGXMLScanner::scanStartTagNS(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    //  Get the QName. In this case, we are not doing namespaces, so we just
    //  use it as is and don't have to break it into parts.

    int  colonPosition;
    bool validName = fReaderMgr.getQName(fQNameBuf, &colonPosition);
    if (!validName)
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // Assume it won't be an empty tag
    bool isEmpty = false;

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    //  Lets try to look up the element in the validator's element decl pool
    //  We can pass bogus values for the URI id and the base name. We know that
    //  this can only be called if we are doing a DTD style validator and that
    //  he will only look at the QName.
    //
    //  We *do not* tell him to fault in a decl if he does not find one - NG.
    bool wasAdded = false;
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();

    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        fEmptyNamespaceId
        , 0
        , qnameRawBuf
        , Grammar::TOP_LEVEL_SCOPE
    );
    // look in the undeclared pool:
    if(!elemDecl)
    {
        elemDecl = fDTDElemNonDeclPool->getByKey(qnameRawBuf);
    }
    if(!elemDecl)
    {
        wasAdded = true;
        elemDecl = new (fMemoryManager) DTDElementDecl
        (
            qnameRawBuf
            , fEmptyNamespaceId
            , DTDElementDecl::Any
            , fMemoryManager
        );
        elemDecl->setId(fDTDElemNonDeclPool->put((DTDElementDecl*)elemDecl));
    }

    if (fValidate) {

        if (wasAdded)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the validator pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }
        // If its not marked declared, then emit an error
        else if (!elemDecl->isDeclared())
        {
            fValidator->emitError
            (
                XMLValid::ElementNotDefined
                , qnameRawBuf
            );
        }


        fValidator->validateElement(elemDecl);
    }

    // Expand the element stack and add the new element
    fElemStack.addLevel(elemDecl, fReaderMgr.getCurrentReaderNum());

    //  If this is the first element and we are validating, check the root
    //  element.
    if (isRoot)
    {
        fRootGrammar = fGrammar;

        if (fValidate)
        {
            //  If a DocType exists, then check if it matches the root name there.
            if (fRootElemName && !XMLString::equals(qnameRawBuf, fRootElemName))
                fValidator->emitError(XMLValid::RootElemNotLikeDocType);
        }
    }
    else if (fValidate)
    {
        //  If the element stack is not empty, then add this element as a
        //  child of the previous top element. If its empty, this is the root
        //  elem and is not the child of anything.
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  We loop until we either see a /> or >, handling attribute/value
    //  pairs until we get there.
    XMLSize_t    attCount = 0;
    XMLSize_t    curAttListSize = fAttrList->size();
    wasAdded = false;

    fElemCount++;

    while (true)
    {
        // And get the next non-space character
        XMLCh nextCh = fReaderMgr.peekNextChar();

        //  If the next character is not a slash or closed angle bracket,
        //  then it must be whitespace, since whitespace is required
        //  between the end of the last attribute and the name of the next
        //  one.
        if (attCount)
        {
            if ((nextCh != chForwardSlash) && (nextCh != chCloseAngle))
            {
                if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                {
                    // Ok, skip by them and peek another char
                    fReaderMgr.skipPastSpaces();
                    nextCh = fReaderMgr.peekNextChar();
                }
                 else
                {
                    // Emit the error but keep on going
                    emitError(XMLErrs::ExpectedWhitespace);
                }
            }
        }

        //  Ok, here we first check for any of the special case characters.
        //  If its not one, then we do the normal case processing, which
        //  assumes that we've hit an attribute value, Otherwise, we do all
        //  the special case checks.
        if (!fReaderMgr.getCurrentReader()->isSpecialStartTagChar(nextCh))
        {
            //  Assume its going to be an attribute, so get a name from
            //  the input.

            validName = fReaderMgr.getQName(fAttNameBuf, &colonPosition);
            if (!validName)
            {
                if (fAttNameBuf.isEmpty())
                    emitError(XMLErrs::ExpectedAttrName);
                else
                    emitError(XMLErrs::InvalidAttrName, fAttNameBuf.getRawBuffer());
                fReaderMgr.skipPastChar(chCloseAngle);
                return false;
            }

            // And next must be an equal sign
            if (!scanEq())
            {
                static const XMLCh tmpList[] =
                {
                    chSingleQuote, chDoubleQuote, chCloseAngle
                    , chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedEqSign);

                //  Try to sync back up by skipping forward until we either
                //  hit something meaningful.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle) || (chFound == chForwardSlash))
                {
                    // Jump back to top for normal processing of these
                    continue;
                }
                else if ((chFound == chSingleQuote)
                      ||  (chFound == chDoubleQuote)
                      ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    // Just fall through assuming that the value is to follow
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  See if this attribute is declared for this element. If we are
            //  not validating of course it will not be at first, but we will
            //  fault it into the pool (to avoid lots of redundant errors.)
            XMLCh * namePtr = fAttNameBuf.getRawBuffer();
            XMLAttDef* attDef = ((DTDElementDecl *)elemDecl)->getAttDef(namePtr);

            //  Skip any whitespace before the value and then scan the att
            //  value. This will come back normalized with entity refs and
            //  char refs expanded.
            fReaderMgr.skipPastSpaces();
            if (!scanAttValue(attDef, namePtr, fAttValueBuf))
            {
                static const XMLCh tmpList[] =
                {
                    chCloseAngle, chOpenAngle, chForwardSlash, chNull
                };

                emitError(XMLErrs::ExpectedAttrValue);

                //  It failed, so lets try to get synced back up. We skip
                //  forward until we find some whitespace or one of the
                //  chars in our list.
                const XMLCh chFound = fReaderMgr.skipUntilInOrWS(tmpList);

                if ((chFound == chCloseAngle)
                ||  (chFound == chForwardSlash)
                ||  fReaderMgr.getCurrentReader()->isWhitespace(chFound))
                {
                    //  Just fall through and process this attribute, though
                    //  the value will be "".
                }
                else if (chFound == chOpenAngle)
                {
                    // Assume a malformed tag and that new one is starting
                    emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
                    return false;
                }
                else
                {
                    // Something went really wrong
                    return false;
                }
            }

            //  Add this attribute to the attribute list that we use to
            //  pass them to the handler. We reuse its existing elements
            //  but expand it as required.
            // Note that we want to this first since this will
            // make a copy of the namePtr; we can then make use of
            // that copy in the hashtable lookup that checks
            // for duplicates.  This will mean we may have to update
            // the type of the XMLAttr later.
            XMLAttr* curAtt;
            const XMLCh* attrValue = fAttValueBuf.getRawBuffer();

            if (attCount >= curAttListSize) {
                curAtt = new (fMemoryManager) XMLAttr(fMemoryManager);
                fAttrList->addElement(curAtt);
            }
            else {
                curAtt = fAttrList->elementAt(attCount);
            }

            curAtt->setSpecified(true);
            // DO NAMESPACES
            {
                curAtt->set(
                    fEmptyNamespaceId, namePtr, XMLUni::fgZeroLenString
                    , (attDef)? attDef->getType() : XMLAttDef::CData
                );

                // each attribute has the prefix:suffix="value"
                const XMLCh* attPrefix = curAtt->getPrefix();
                const XMLCh* attLocalName = curAtt->getName();

                if (attPrefix && *attPrefix) {
                    if (XMLString::equals(attPrefix, XMLUni::fgXMLString)) {
                        curAtt->setURIId(fXMLNamespaceId);
                    }
                    else if (XMLString::equals(attPrefix, XMLUni::fgXMLNSString)) {
                        curAtt->setURIId(fXMLNSNamespaceId);
                        updateNSMap(attPrefix, attLocalName, attrValue);
                    }
                    else {
                        fAttrNSList->addElement(curAtt);
                    }
                }
                else if (XMLString::equals(XMLUni::fgXMLNSString, attLocalName))
                {
                    updateNSMap(attPrefix, XMLUni::fgZeroLenString, attrValue);
                }

                // NOTE: duplicate attribute check will be done, when we map
                //       namespaces to all attributes
                if (attDef) {
                    unsigned int *curCountPtr = fAttDefRegistry->get(attDef);
                    if (!curCountPtr) {
                        curCountPtr = getNewUIntPtr();
                        *curCountPtr = fElemCount;
                        fAttDefRegistry->put(attDef, curCountPtr);
                   }
                    else if (*curCountPtr < fElemCount) {
                        *curCountPtr = fElemCount;
                    }
                }
            }

            if (fValidate)
            {
                if (attDef) {
                    // Let the validator pass judgement on the attribute value
                    fValidator->validateAttrValue(
                        attDef, fAttValueBuf.getRawBuffer(), false, elemDecl
                    );
                }
                else
                {
                    fValidator->emitError
                    (
                        XMLValid::AttNotDefinedForElement
                        , fAttNameBuf.getRawBuffer(), qnameRawBuf
                    );
                }
            }

            // must set the newly-minted value on the XMLAttr:
            curAtt->setValue(attrValue);
            attCount++;

            // And jump back to the top of the loop
            continue;
        }

        //  It was some special case character so do all of the checks and
        //  deal with it.
        if (!nextCh)
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

        if (nextCh == chForwardSlash)
        {
            fReaderMgr.getNextChar();
            isEmpty = true;
            if (!fReaderMgr.skippedChar(chCloseAngle))
                emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if (nextCh == chCloseAngle)
        {
            fReaderMgr.getNextChar();
            break;
        }
        else if (nextCh == chOpenAngle)
        {
            //  Check for this one specially, since its going to be common
            //  and it is kind of auto-recovering since we've already hit the
            //  next open bracket, which is what we would have seeked to (and
            //  skipped this whole tag.)
            emitError(XMLErrs::UnterminatedStartTag, elemDecl->getFullName());
            break;
        }
        else if ((nextCh == chSingleQuote) || (nextCh == chDoubleQuote))
        {
            //  Check for this one specially, which is probably a missing
            //  attribute name, e.g. ="value". Just issue expected name
            //  error and eat the quoted string, then jump back to the
            //  top again.
            emitError(XMLErrs::ExpectedAttrName);
            fReaderMgr.getNextChar();
            fReaderMgr.skipQuotedString(nextCh);
            fReaderMgr.skipPastSpaces();
            continue;
        }
    }

    //  Make an initial pass through the list and find any xmlns attributes.
    if (attCount)
      scanAttrListforNameSpaces(fAttrList, attCount, elemDecl);

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(attCount, elemDecl, *fAttrList);

    //  If we have a document handler, then tell it about this start tag. We
    //  don't have any URI id to send along, so send fEmptyNamespaceId. We also do not send
    //  any prefix since its just one big name if we are not doing namespaces.
    if (fDocHandler)
    {
        unsigned int uriId = resolvePrefix
            (
                elemDecl->getElementName()->getPrefix()
                , ElemStack::Mode_Element
            );

        fDocHandler->startElement
        (
            *elemDecl
            , uriId
            , elemDecl->getElementName()->getPrefix()
            , *fAttrList
            , attCount
            , isEmpty
            , isRoot
        );
    }

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , qnameRawBuf
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If the elem stack is empty, then it was an empty root
        if (isRoot)
            gotData = false;
    }

    return true;
}